

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  tm *ptVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  int local_1b4;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_59;
  undefined1 local_58 [8];
  tm time_struct;
  time_t seconds;
  TimeInMillis ms_local;
  
  time_struct.tm_zone = (char *)((long)this / 1000);
  ptVar1 = localtime_r((time_t *)&time_struct.tm_zone,(tm *)local_58);
  if (ptVar1 == (tm *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    local_1b4 = time_struct.tm_mday + 0x76c;
    StreamableToString<int>(&local_1b0,&local_1b4);
    std::operator+(&local_190,&local_1b0,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1d8,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_170,&local_190,&local_1d8);
    std::operator+(&local_150,&local_170,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1f8,(String *)(ulong)(uint)time_struct.tm_min,value_00);
    std::operator+(&local_130,&local_150,&local_1f8);
    std::operator+(&local_110,&local_130,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_218,(String *)(ulong)(uint)time_struct.tm_sec,value_01);
    std::operator+(&local_f0,&local_110,&local_218);
    std::operator+(&local_d0,&local_f0,":");
    String::FormatIntWidth2_abi_cxx11_(&local_238,(String *)(ulong)(uint)local_58._4_4_,value_02);
    std::operator+(&local_b0,&local_d0,&local_238);
    std::operator+(&local_90,&local_b0,":");
    String::FormatIntWidth2_abi_cxx11_(&local_258,(String *)(ulong)(uint)local_58._0_4_,value_03);
    std::operator+(__return_storage_ptr__,&local_90,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  time_t seconds = static_cast<time_t>(ms / 1000);
  struct tm time_struct;
#ifdef _MSC_VER
  if (localtime_s(&time_struct, &seconds) != 0)
    return "";  // Invalid ms value
#else
  if (localtime_r(&seconds, &time_struct) == NULL)
    return "";  // Invalid ms value
#endif

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}